

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O2

any __thiscall
cs_impl::
cni_helper<std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>_(*)(std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&,_std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>_&),_std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>_(*)(std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&,_std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>_&)>
::call(cni_helper<std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>_(*)(std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&,_std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>_&),_std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>_(*)(std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&,_std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>_&)>
       *this,vector *args)

{
  runtime_error *this_00;
  vector *in_RDX;
  _Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*> local_c0;
  string local_a0;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if ((long)(in_RDX->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(in_RDX->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
            super__Vector_impl_data._M_start == 0x10) {
    cni_helper<std::_Deque_iterator<cs_impl::any,cs_impl::any&,cs_impl::any*>(*)(std::deque<cs_impl::any,std::allocator<cs_impl::any>>&,std::_Deque_iterator<cs_impl::any,cs_impl::any&,cs_impl::any*>&),std::_Deque_iterator<cs_impl::any,cs_impl::any&,cs_impl::any*>(*)(std::deque<cs_impl::any,std::allocator<cs_impl::any>>&,std::_Deque_iterator<cs_impl::any,cs_impl::any&,cs_impl::any*>&)>
    ::_call<0,1>(&local_c0,args,in_RDX,(sequence<0,_1> *)&cov::make_sequence<0,0,1>::result);
    any::
    make_constant<std::_Deque_iterator<cs_impl::any,cs_impl::any&,cs_impl::any*>,std::_Deque_iterator<cs_impl::any,cs_impl::any&,cs_impl::any*>const&>
              ((any *)this,&local_c0);
    return (any)(proxy *)this;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x28);
  std::__cxx11::to_string(&local_80,2);
  std::operator+(&local_60,"Wrong size of the arguments. Expected ",&local_80);
  std::operator+(&local_40,&local_60,", provided ");
  std::__cxx11::to_string
            (&local_a0,
             (long)(in_RDX->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl
                   .super__Vector_impl_data._M_finish -
             (long)(in_RDX->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl
                   .super__Vector_impl_data._M_start >> 3);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c0,
                 &local_40,&local_a0);
  cs::runtime_error::runtime_error(this_00,(string *)&local_c0);
  __cxa_throw(this_00,&cs::runtime_error::typeinfo,cs::runtime_error::~runtime_error);
}

Assistant:

any call(cs::vector &args) const
		{
			if (args.size() != sizeof...(_Target_ArgsT))
				throw cs::runtime_error(
				    "Wrong size of the arguments. Expected " + std::to_string(sizeof...(_Target_ArgsT)) +
				    ", provided " +
				    std::to_string(args.size()));
			return return_to_cs(_call(args, cov::make_sequence<sizeof...(_Source_ArgsT)>::result));
		}